

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_ai_lookup.hpp
# Opt level: O1

void __thiscall PatchOptimizeAILookup::load_from_rom(PatchOptimizeAILookup *this,ROM *rom)

{
  byte bVar1;
  byte bVar2;
  pointer puVar3;
  pointer ppVar4;
  ushort uVar5;
  ushort uVar6;
  ulong uVar7;
  value_type local_18;
  
  local_18.first = 0xffffffff;
  local_18.second = 0xffffffff;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::resize(&this->_ai_addrs_for_enemy_id,0xfe,&local_18);
  puVar3 = (rom->_byte_array).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = *(ushort *)(puVar3 + 0x1a8418) << 8 | *(ushort *)(puVar3 + 0x1a8418) >> 8;
  if (uVar5 != 0xffff) {
    ppVar4 = (this->_ai_addrs_for_enemy_id).
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = 0;
    uVar6 = 1;
    do {
      bVar1 = puVar3[uVar7 * 8 + 0x1a84ac];
      bVar2 = puVar3[uVar7 * 8 + 0x1a84ad];
      ppVar4[uVar5].first =
           ((int)(short)((ushort)puVar3[uVar7 * 8 + 0x1a84a8] << 8) |
           (uint)puVar3[uVar7 * 8 + 0x1a84a9]) + (int)uVar7 * 8 + 0x1a84a8;
      ppVar4[uVar5].second =
           ((int)(short)((ushort)bVar1 << 8) | (uint)bVar2) + (int)uVar7 * 8 + 0x1a84ac;
      uVar7 = (ulong)uVar6;
      uVar5 = *(ushort *)(puVar3 + uVar7 * 2 + 0x1a8418) << 8 |
              *(ushort *)(puVar3 + uVar7 * 2 + 0x1a8418) >> 8;
      uVar6 = uVar6 + 1;
    } while (uVar5 != 0xffff);
  }
  return;
}

Assistant:

void load_from_rom(const md::ROM& rom) override
    {
        _ai_addrs_for_enemy_id.resize(0xFE, std::make_pair(0xFFFFFFFF, 0xFFFFFFFF));

        uint16_t i = 0;
        while(rom.get_word(offsets::ENEMY_AI_TABLE + (i*2)) != 0xFFFF)
        {
            uint16_t enemy_id = rom.get_word(offsets::ENEMY_AI_TABLE + (i*2));

            uint32_t branch_instruction_addr = offsets::ENEMY_AI_JUMP_TABLE + (i*8);
            int16_t jump_offset_A = (int16_t)rom.get_word(branch_instruction_addr + 2);
            uint32_t jump_destination_A = branch_instruction_addr + 2 + jump_offset_A;

            branch_instruction_addr += 4;
            int16_t jump_offset_B = (int16_t)rom.get_word(branch_instruction_addr + 2);
            uint32_t jump_destination_B = branch_instruction_addr + 2 + jump_offset_B;

            _ai_addrs_for_enemy_id[enemy_id] = std::make_pair(jump_destination_A, jump_destination_B);
            ++i;
        }
    }